

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

bool wasm::PossibleContents::haveIntersection(PossibleContents *a,PossibleContents *b)

{
  bool bVar1;
  bool bVar2;
  BasicHeapType BVar3;
  BasicHeapType BVar4;
  size_t sVar5;
  size_t sVar6;
  ConeType CVar7;
  size_t bDepthFromRoot;
  size_t aDepthFromRoot;
  bool bSubA;
  HeapType HStack_40;
  bool aSubB;
  HeapType bHeapType;
  HeapType aHeapType;
  Type bType;
  Type aType;
  PossibleContents *b_local;
  PossibleContents *a_local;
  
  bVar1 = isNone(a);
  if ((bVar1) || (bVar1 = isNone(b), bVar1)) {
    a_local._7_1_ = false;
  }
  else {
    bVar1 = isMany(a);
    if ((bVar1) || (bVar1 = isMany(b), bVar1)) {
      a_local._7_1_ = true;
    }
    else {
      bType = getType(a);
      aHeapType.id = (uintptr_t)getType(b);
      bVar1 = wasm::Type::isRef(&bType);
      if ((bVar1) && (bVar1 = wasm::Type::isRef((Type *)&aHeapType), bVar1)) {
        bHeapType = wasm::Type::getHeapType(&bType);
        HStack_40 = wasm::Type::getHeapType((Type *)&aHeapType);
        bVar1 = wasm::Type::isNullable(&bType);
        if ((bVar1) && (bVar1 = wasm::Type::isNullable((Type *)&aHeapType), bVar1)) {
          BVar3 = HeapType::getBottom(&bHeapType);
          BVar4 = HeapType::getBottom(&stack0xffffffffffffffc0);
          if (BVar3 == BVar4) {
            return true;
          }
        }
        bVar1 = isNull(a);
        if ((bVar1) || (bVar1 = isNull(b), bVar1)) {
          a_local._7_1_ = false;
        }
        else {
          bVar1 = HeapType::isSubType(bHeapType,HStack_40);
          bVar2 = HeapType::isSubType(HStack_40,bHeapType);
          if ((bVar1) || (bVar2)) {
            sVar5 = HeapType::getDepth(&bHeapType);
            sVar6 = HeapType::getDepth(&stack0xffffffffffffffc0);
            if (bVar1) {
              if (sVar5 < sVar6) {
                __assert_fail("aDepthFromRoot >= bDepthFromRoot",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                              ,0x152,
                              "static bool wasm::PossibleContents::haveIntersection(const PossibleContents &, const PossibleContents &)"
                             );
              }
              CVar7 = getCone(b);
              a_local._7_1_ = sVar5 - sVar6 <= (ulong)CVar7.depth;
            }
            else {
              if (!bVar2) {
                handle_unreachable("we ruled out no subtyping before",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                                   ,0x158);
              }
              if (sVar6 < sVar5) {
                __assert_fail("bDepthFromRoot >= aDepthFromRoot",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                              ,0x155,
                              "static bool wasm::PossibleContents::haveIntersection(const PossibleContents &, const PossibleContents &)"
                             );
              }
              CVar7 = getCone(a);
              a_local._7_1_ = sVar6 - sVar5 <= (ulong)CVar7.depth;
            }
          }
          else {
            a_local._7_1_ = false;
          }
        }
      }
      else {
        a_local._7_1_ = wasm::Type::operator==(&bType,(Type *)&aHeapType);
      }
    }
  }
  return a_local._7_1_;
}

Assistant:

bool PossibleContents::haveIntersection(const PossibleContents& a,
                                        const PossibleContents& b) {
  if (a.isNone() || b.isNone()) {
    // One is the empty set, so nothing can intersect here.
    return false;
  }

  if (a.isMany() || b.isMany()) {
    // One is the set of all things, so definitely something can intersect since
    // we've ruled out an empty set for both.
    return true;
  }

  auto aType = a.getType();
  auto bType = b.getType();

  if (!aType.isRef() || !bType.isRef()) {
    // At least one is not a reference. The only way they can intersect is if
    // the type is identical.
    return aType == bType;
  }

  // From here on we focus on references.

  auto aHeapType = aType.getHeapType();
  auto bHeapType = bType.getHeapType();

  if (aType.isNullable() && bType.isNullable() &&
      aHeapType.getBottom() == bHeapType.getBottom()) {
    // A compatible null is possible on both sides.
    return true;
  }

  // We ruled out having a compatible null on both sides. If one is simply a
  // null then no chance for an intersection remains.
  if (a.isNull() || b.isNull()) {
    return false;
  }

  auto aSubB = HeapType::isSubType(aHeapType, bHeapType);
  auto bSubA = HeapType::isSubType(bHeapType, aHeapType);
  if (!aSubB && !bSubA) {
    // No type can appear in both a and b, so the types differ, so the values
    // do not overlap.
    return false;
  }

  // From here on we focus on references and can ignore the case of null - any
  // intersection must be of a non-null value, so we can focus on the heap
  // types.

  auto aDepthFromRoot = aHeapType.getDepth();
  auto bDepthFromRoot = bHeapType.getDepth();

  if (aSubB) {
    // A is a subtype of B. For there to be an intersection we need their cones
    // to intersect, that is, to rule out the case where the cone from B is not
    // deep enough to reach A.
    assert(aDepthFromRoot >= bDepthFromRoot);
    return aDepthFromRoot - bDepthFromRoot <= b.getCone().depth;
  } else if (bSubA) {
    assert(bDepthFromRoot >= aDepthFromRoot);
    return bDepthFromRoot - aDepthFromRoot <= a.getCone().depth;
  } else {
    WASM_UNREACHABLE("we ruled out no subtyping before");
  }

  // TODO: we can also optimize things like different Literals, but existing
  //       passes do such things already so it is low priority.
}